

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateFunctionCall(ExpressionEvalContext *ctx,ExprFunctionCall *expression)

{
  ExprBase *context;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  StackFrame **ppSVar4;
  ExprBase *pEVar5;
  ArrayView<ExprBase_*> arguments_00;
  ArrayView<ExprBase_*> arguments_01;
  ArrayView<ExprBase*> local_e0 [16];
  ExprBase *local_d0;
  ExprBase *call;
  ExprFunctionDefinition *declaration;
  undefined4 local_b8;
  ExpressionEvalContext *local_b0;
  ExprBase *result;
  ExprFunctionLiteral *ptr;
  ExprBase *local_90;
  ExprBase *value;
  ExprBase *curr;
  SmallArray<ExprBase_*,_8U> arguments;
  ExprBase *function;
  ExprFunctionCall *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar4 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar4)->targetYield != 0)) {
    pEVar5 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar5,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar5;
  }
  bVar1 = AddInstruction(ctx);
  if (!bVar1) {
    return (ExprBase *)0x0;
  }
  arguments.allocator = (Allocator *)Evaluate(ctx,expression->function);
  if ((ExprBase *)arguments.allocator == (ExprBase *)0x0) {
    return (ExprBase *)0x0;
  }
  SmallArray<ExprBase_*,_8U>::SmallArray((SmallArray<ExprBase_*,_8U> *)&curr,ctx->ctx->allocator);
  for (value = (expression->arguments).head; value != (ExprBase *)0x0; value = value->next) {
    local_90 = Evaluate(ctx,value);
    if (local_90 == (ExprBase *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
      goto LAB_00169ef5;
    }
    SmallArray<ExprBase_*,_8U>::push_back((SmallArray<ExprBase_*,_8U> *)&curr,&local_90);
  }
  result = &getType<ExprFunctionLiteral>((ExprBase *)arguments.allocator)->super_ExprBase;
  if ((ExprFunctionLiteral *)result == (ExprFunctionLiteral *)0x0) {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  else if (((ExprFunctionLiteral *)result)->data == (FunctionData *)0x0) {
    ctx_local = (ExpressionEvalContext *)Report(ctx,"ERROR: null function pointer call");
  }
  else if (((ExprFunctionLiteral *)result)->data->declaration == (ExprBase *)0x0) {
    if (((ctx->emulateKnownExternals & 1U) != 0) &&
       (uVar2 = ExpressionContext::GetFunctionIndex(ctx->ctx,((ExprFunctionLiteral *)result)->data),
       pEVar5 = result, uVar2 < ctx->ctx->baseModuleFunctionCount)) {
      ArrayView<ExprBase*>::ArrayView<8u>
                ((ArrayView<ExprBase*> *)&declaration,(SmallArray<ExprBase_*,_8U> *)&curr);
      arguments_00._12_4_ = 0;
      arguments_00.data = (ExprBase **)declaration;
      arguments_00.count = local_b8;
      local_b0 = (ExpressionEvalContext *)
                 EvaluateKnownExternalFunctionCall
                           (ctx,expression,(ExprFunctionLiteral *)pEVar5,arguments_00);
      ctx_local = local_b0;
      if (local_b0 != (ExpressionEvalContext *)0x0) goto LAB_00169ef5;
    }
    ctx_local = (ExpressionEvalContext *)
                Report(ctx,"ERROR: function \'%.*s\' has no source",
                       (ulong)(uint)((int)*(undefined8 *)(result[1]._vptr_ExprBase[7] + 0x48) -
                                    (int)*(undefined8 *)(result[1]._vptr_ExprBase[7] + 0x40)),
                       *(undefined8 *)(result[1]._vptr_ExprBase[7] + 0x40));
  }
  else if ((((ExprFunctionLiteral *)result)->data->isPrototype & 1U) == 0) {
    call = &getType<ExprFunctionDefinition>(((ExprFunctionLiteral *)result)->data->declaration)->
            super_ExprBase;
    if ((ExprFunctionDefinition *)call == (ExprFunctionDefinition *)0x0) {
      __assert_fail("declaration",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xad2,
                    "ExprBase *EvaluateFunctionCall(ExpressionEvalContext &, ExprFunctionCall *)");
    }
    uVar2 = IntrusiveList<ExprVariableDefinition>::size
                      (&((ExprFunctionDefinition *)call)->arguments);
    uVar3 = SmallArray<ExprBase_*,_8U>::size((SmallArray<ExprBase_*,_8U> *)&curr);
    pEVar5 = call;
    if (uVar2 == uVar3) {
      context = *(ExprBase **)&result[1].typeID;
      ArrayView<ExprBase*>::ArrayView<8u>(local_e0,(SmallArray<ExprBase_*,_8U> *)&curr);
      arguments_01._12_4_ = 0;
      arguments_01._0_12_ = local_e0._0_12_;
      local_d0 = EvaluateFunction(ctx,(ExprFunctionDefinition *)pEVar5,context,arguments_01);
      if (local_d0 == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,local_d0);
      }
    }
    else {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)
                Report(ctx,"ERROR: function \'%.*s\' has no source",
                       (ulong)(uint)((int)(((ExprFunctionLiteral *)result)->data->name->name).end -
                                    (int)(((ExprFunctionLiteral *)result)->data->name->name).begin),
                       (((ExprFunctionLiteral *)result)->data->name->name).begin);
  }
LAB_00169ef5:
  ptr._0_4_ = 1;
  SmallArray<ExprBase_*,_8U>::~SmallArray((SmallArray<ExprBase_*,_8U> *)&curr);
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateFunctionCall(ExpressionEvalContext &ctx, ExprFunctionCall *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;
	
	ExprBase *function = Evaluate(ctx, expression->function);

	if(!function)
		return NULL;

	SmallArray<ExprBase*, 8> arguments(ctx.ctx.allocator);

	for(ExprBase *curr = expression->arguments.head; curr; curr = curr->next)
	{
		ExprBase *value = Evaluate(ctx, curr);

		if(!value)
			return NULL;

		arguments.push_back(value);
	}

	ExprFunctionLiteral *ptr = getType<ExprFunctionLiteral>(function);

	if(!ptr)
		return NULL;

	if(!ptr->data)
		return Report(ctx, "ERROR: null function pointer call");

	if(!ptr->data->declaration)
	{
		if(ctx.emulateKnownExternals && ctx.ctx.GetFunctionIndex(ptr->data) < ctx.ctx.baseModuleFunctionCount)
		{
			if(ExprBase *result = EvaluateKnownExternalFunctionCall(ctx, expression, ptr, arguments))
				return result;
		}

		return Report(ctx, "ERROR: function '%.*s' has no source", FMT_ISTR(ptr->data->name->name));
	}

	if(ptr->data->isPrototype)
		return Report(ctx, "ERROR: function '%.*s' has no source", FMT_ISTR(ptr->data->name->name));

	ExprFunctionDefinition *declaration = getType<ExprFunctionDefinition>(ptr->data->declaration);

	assert(declaration);

	if(declaration->arguments.size() != arguments.size())
		return NULL;

	ExprBase *call = EvaluateFunction(ctx, declaration, ptr->context, arguments);

	if(!call)
		return NULL;

	return CheckType(expression, call);
}